

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O3

QGraphicsLayoutItem * __thiscall
QGraphicsGridLayout::itemAt(QGraphicsGridLayout *this,int row,int column)

{
  int iVar1;
  long lVar2;
  Orientation OVar3;
  QGraphicsLayoutItem *pQVar4;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row) {
    OVar3 = (int)(this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d + 0x118;
    iVar1 = QGridLayoutEngine::effectiveLastRow(OVar3);
    if ((-1 < column) && (row <= iVar1)) {
      iVar1 = QGridLayoutEngine::effectiveLastRow
                        ((int)(this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d +
                         0x118);
      if (column <= iVar1) {
        lVar2 = QGridLayoutEngine::itemAt(OVar3,row,column);
        if (lVar2 == 0) {
          pQVar4 = (QGraphicsLayoutItem *)0x0;
        }
        else {
          pQVar4 = *(QGraphicsLayoutItem **)(lVar2 + 0x28);
        }
        goto LAB_005d4bab;
      }
    }
  }
  local_48[0] = '\x02';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_30 = "default";
  pQVar4 = (QGraphicsLayoutItem *)0x0;
  QMessageLogger::warning
            (local_48,"QGraphicsGridLayout::itemAt: invalid row, column %d, %d",row,
             (ulong)(uint)column);
LAB_005d4bab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsLayoutItem *QGraphicsGridLayout::itemAt(int row, int column) const
{
    Q_D(const QGraphicsGridLayout);
    if (row < 0 || row >= rowCount() || column < 0 || column >= columnCount()) {
        qWarning("QGraphicsGridLayout::itemAt: invalid row, column %d, %d", row, column);
        return nullptr;
    }
    if (QGraphicsGridLayoutEngineItem *engineItem = static_cast<QGraphicsGridLayoutEngineItem*>(d->engine.itemAt(row, column)))
        return engineItem->layoutItem();
    return nullptr;
}